

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseSwitchStatement_AtFirst
          (Parser *this,StatementSyntax **stmt,StatementContext stmtCtx)

{
  bool bVar1;
  StatementContext stmtCtx_00;
  SyntaxToken *pSVar2;
  SwitchStatementSyntax *pSVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ != Keyword_switch) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,499);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"assert failure: `switch\'",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return false;
  }
  pSVar3 = makeNode<psy::C::SwitchStatementSyntax>(this);
  *stmt = &pSVar3->super_StatementSyntax;
  IVar4 = consume(this);
  pSVar3->switchKwTkIdx_ = IVar4;
  bVar1 = match(this,OpenParenToken,&pSVar3->openParenTkIdx_);
  if (((bVar1) && (bVar1 = parseExpression(this,&pSVar3->cond_), bVar1)) &&
     (bVar1 = match(this,CloseParenToken,&pSVar3->closeParenTkIdx_), bVar1)) {
    stmtCtx_00 = operator+(stmtCtx,Switch);
    bVar1 = parseStatement(this,&pSVar3->stmt_,stmtCtx_00);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = ignoreStatement(this);
  return bVar1;
}

Assistant:

bool Parser::parseSwitchStatement_AtFirst(StatementSyntax*& stmt,
                                          StatementContext stmtCtx)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_switch,
                     return false,
                     "assert failure: `switch'");

    auto switchStmt = makeNode<SwitchStatementSyntax>();
    stmt = switchStmt;
    switchStmt->switchKwTkIdx_ = consume();

    return checkStatementParse(
                match(SyntaxKind::OpenParenToken, &switchStmt->openParenTkIdx_)
                && parseExpression(switchStmt->cond_)
                && match(SyntaxKind::CloseParenToken, &switchStmt->closeParenTkIdx_)
                && parseStatement(switchStmt->stmt_,
                                  stmtCtx + StatementContext::Switch));
}